

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

StringRef __thiscall llvm::AArch64::getDefaultCPU(AArch64 *this,StringRef Arch)

{
  ArchKind AVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  StringRef SVar5;
  StringRef Arch_00;
  
  Arch_00.Length = Arch.Data;
  Arch_00.Data = (char *)this;
  AVar1 = parseArch(Arch_00);
  if (AVar1 == INVALID) {
    pcVar2 = (char *)0x0;
    sVar4 = 0;
  }
  else {
    lVar3 = 0x14;
    pcVar2 = "generic";
    do {
      if ((*(ArchKind *)((long)&PTR_anon_var_dwarf_40dde4_00202208 + lVar3 + 4) == AVar1) &&
         (*(char *)((long)&(anonymous_namespace)::AArch64CPUNames + lVar3) == '\x01')) {
        pcVar2 = *(char **)(&UNK_002021fc + lVar3);
        sVar4 = *(size_t *)((long)&PTR_anon_var_dwarf_400c95_00202200 + lVar3 + 4);
        goto LAB_001a5b56;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x2b4);
    sVar4 = 7;
  }
LAB_001a5b56:
  SVar5.Length = sVar4;
  SVar5.Data = pcVar2;
  return SVar5;
}

Assistant:

StringRef llvm::AArch64::getDefaultCPU(StringRef Arch) {
  AArch64::ArchKind AK = parseArch(Arch);
  if (AK == ArchKind::INVALID)
    return StringRef();

  // Look for multiple AKs to find the default for pair AK+Name.
  for (const auto &CPU : AArch64CPUNames)
    if (CPU.ArchID == AK && CPU.Default)
      return CPU.getName();

  // If we can't find a default then target the architecture instead
  return "generic";
}